

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_Not_Test::Body(iu_Matcher_x_iutest_x_Not_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  AssertionResult *in_R8;
  NeMatcher<int> NVar3;
  int local_4b4;
  string local_4b0;
  string local_490;
  AssertionHelper local_470;
  Fixed local_440;
  int local_2b8 [2];
  NeMatcher<int> local_2b0;
  NotMatcher<iutest::detail::NeMatcher<int>_> local_2a0;
  undefined1 local_288 [8];
  AssertionResult iutest_ar_1;
  string local_258;
  string local_238;
  AssertionHelper local_218;
  Fixed local_1e8;
  int local_50 [2];
  NotMatcher<int> local_48;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_Not_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_50[1] = 1;
  iutest::matchers::Not<int>((matchers *)&local_48,local_50 + 1);
  local_50[0] = 0x2a;
  iutest::detail::NotMatcher<int>::operator()((AssertionResult *)local_38,&local_48,local_50);
  iutest::detail::NotMatcher<int>::~NotMatcher(&local_48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e8);
    iutest_ar_1._36_4_ = 0x2a;
    iutest::PrintToString<int>(&local_258,(int *)&iutest_ar_1.field_0x24);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_238,pdVar2,"Not(1)",local_38,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,399,&local_238,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_218,&local_1e8);
    iutest::AssertionHelper::~AssertionHelper(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_2b8[1] = 0x2a;
  NVar3 = iutest::matchers::Ne<int>((matchers *)&local_2b0,local_2b8 + 1);
  iutest::matchers::Not<iutest::detail::NeMatcher<int>>
            (&local_2a0,(matchers *)&local_2b0,(NeMatcher<int> *)NVar3.m_expected);
  local_2b8[0] = 0x2a;
  iutest::detail::NotMatcher<iutest::detail::NeMatcher<int>>::operator()
            ((AssertionResult *)local_288,(NotMatcher<iutest::detail::NeMatcher<int>> *)&local_2a0,
             local_2b8);
  iutest::detail::NotMatcher<iutest::detail::NeMatcher<int>_>::~NotMatcher(&local_2a0);
  iutest::detail::NeMatcher<int>::~NeMatcher(&local_2b0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    memset(&local_440,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_440);
    local_4b4 = 0x2a;
    iutest::PrintToString<int>(&local_4b0,&local_4b4);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_490,pdVar2,"Not(Ne(42))",local_288,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,400,&local_490,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_470,&local_440);
    iutest::AssertionHelper::~AssertionHelper(&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_440);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  return;
}

Assistant:

IUTEST(Matcher, Not)
{
    IUTEST_EXPECT_THAT(42, Not(1));
    IUTEST_EXPECT_THAT(42, Not(Ne(42)));
}